

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setup(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  cpp_dec_float<100U,_int,_void> *f;
  cpp_dec_float<100U,_int,_void> *in_RDI;
  int i;
  int d;
  undefined4 in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffdfc;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffffe00;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe08;
  undefined1 local_164 [160];
  undefined4 local_c4;
  undefined1 local_c0 [80];
  int local_70;
  int local_6c;
  undefined8 local_60;
  undefined4 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  reference local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  reference local_18;
  undefined1 *local_10;
  undefined4 *local_8;
  
  bVar1 = isSetup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_RDI);
  if (!bVar1) {
    IdxSet::clear((IdxSet *)in_RDI);
    local_6c = dim((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x51674d);
    *(int *)((long)(in_RDI->data)._M_elems + 8) = 0;
    for (local_70 = 0; local_70 < local_6c; local_70 = local_70 + 1) {
      f = &std::
           vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         *)((long)(in_RDI->data)._M_elems + 0x20),(long)local_70)->m_backend;
      local_c4 = 0;
      local_50 = local_c0;
      local_58 = &local_c4;
      local_60 = 0;
      local_8 = local_58;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (in_stack_fffffffffffffe00,
                 CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),in_RDI);
      bVar1 = boost::multiprecision::operator!=
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)f,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)0x51680f);
      if (bVar1) {
        local_30 = std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 *)((long)(in_RDI->data)._M_elems + 0x20),(long)local_70);
        local_28 = local_164;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(in_RDI,f);
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)f);
        getEpsilon(in_stack_fffffffffffffe08);
        tVar2 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)f,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x516891);
        if (tVar2) {
          in_stack_fffffffffffffdf8 = 0;
          local_38 = &stack0xfffffffffffffdfc;
          local_40 = &stack0xfffffffffffffdf8;
          local_48 = 0;
          local_10 = local_40;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                    (in_stack_fffffffffffffe00,(ulong)in_stack_fffffffffffffdfc << 0x20,in_RDI);
          local_18 = std::
                     vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   *)((long)(in_RDI->data)._M_elems + 0x20),(long)local_70);
          local_20 = &stack0xfffffffffffffdfc;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(in_RDI,f);
        }
        else {
          (*(int **)((long)(in_RDI->data)._M_elems + 0x10))
          [*(int *)((long)(in_RDI->data)._M_elems + 8)] = local_70;
          *(int *)((long)(in_RDI->data)._M_elems + 8) =
               *(int *)((long)(in_RDI->data)._M_elems + 8) + 1;
        }
      }
    }
    *(undefined1 *)((long)(in_RDI->data)._M_elems + 0x38) = 1;
  }
  return;
}

Assistant:

void setup()
   {
      if(!isSetup())
      {
         IdxSet::clear();

         int d = dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(VectorBase<R>::val[i] != R(0))
            {
               if(spxAbs(VectorBase<R>::val[i]) <= this->getEpsilon())
                  VectorBase<R>::val[i] = R(0);
               else
               {
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;

         assert(isConsistent());
      }
   }